

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-server.c
# Opt level: O0

int pipe_echo_start(char *pipeName)

{
  FILE *pFVar1;
  char *pcVar2;
  undefined1 local_1d8 [8];
  uv_fs_t req;
  int r;
  char *pipeName_local;
  
  uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)local_1d8,pipeName,(uv_fs_cb)0x0);
  uv_fs_req_cleanup((uv_fs_t *)local_1d8);
  server = (uv_handle_t *)&pipeServer;
  serverType = PIPE;
  req.bufsml[3].len._4_4_ = uv_pipe_init(loop,&pipeServer,0);
  pFVar1 = _stderr;
  if (req.bufsml[3].len._4_4_ == 0) {
    req.bufsml[3].len._4_4_ = uv_pipe_bind(&pipeServer,pipeName);
    pFVar1 = _stderr;
    if (req.bufsml[3].len._4_4_ == 0) {
      req.bufsml[3].len._4_4_ = uv_listen((uv_stream_t *)&pipeServer,0x1000,on_connection);
      pFVar1 = _stderr;
      if (req.bufsml[3].len._4_4_ == 0) {
        pipeName_local._4_4_ = 0;
      }
      else {
        pcVar2 = uv_strerror(req.bufsml[3].len._4_4_);
        fprintf(pFVar1,"uv_pipe_listen: %s\n",pcVar2);
        pipeName_local._4_4_ = 1;
      }
    }
    else {
      pcVar2 = uv_strerror(req.bufsml[3].len._4_4_);
      fprintf(pFVar1,"uv_pipe_bind: %s\n",pcVar2);
      pipeName_local._4_4_ = 1;
    }
  }
  else {
    pcVar2 = uv_strerror(req.bufsml[3].len._4_4_);
    fprintf(pFVar1,"uv_pipe_init: %s\n",pcVar2);
    pipeName_local._4_4_ = 1;
  }
  return pipeName_local._4_4_;
}

Assistant:

static int pipe_echo_start(char* pipeName) {
  int r;

#ifndef _WIN32
  {
    uv_fs_t req;
    uv_fs_unlink(NULL, &req, pipeName, NULL);
    uv_fs_req_cleanup(&req);
  }
#endif

  server = (uv_handle_t*)&pipeServer;
  serverType = PIPE;

  r = uv_pipe_init(loop, &pipeServer, 0);
  if (r) {
    fprintf(stderr, "uv_pipe_init: %s\n", uv_strerror(r));
    return 1;
  }

  r = uv_pipe_bind(&pipeServer, pipeName);
  if (r) {
    fprintf(stderr, "uv_pipe_bind: %s\n", uv_strerror(r));
    return 1;
  }

  r = uv_listen((uv_stream_t*)&pipeServer, SOMAXCONN, on_connection);
  if (r) {
    fprintf(stderr, "uv_pipe_listen: %s\n", uv_strerror(r));
    return 1;
  }

  return 0;
}